

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

char * str_find(char *haystack,char *needle)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  
  do {
    pcVar1 = haystack;
    cVar3 = *haystack;
    lVar2 = 1;
    if (cVar3 == '\0') {
      return (char *)0x0;
    }
    while ((cVar3 != '\0' && (cVar3 == needle[lVar2 + -1]))) {
      cVar3 = haystack[lVar2];
      lVar2 = lVar2 + 1;
    }
    haystack = haystack + 1;
  } while (needle[lVar2 + -1] != '\0');
  return pcVar1;
}

Assistant:

const char *str_find(const char *haystack, const char *needle)
{
	while(*haystack) /* native implementation */
	{
		const char *a = haystack;
		const char *b = needle;
		while(*a && *b && *a == *b)
		{
			a++;
			b++;
		}
		if(!(*b))
			return haystack;
		haystack++;
	}

	return 0;
}